

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_suite.cpp
# Opt level: O0

void __thiscall
sqlcheck::TestSuite_MetadataTribblesTest_Test::TestBody(TestSuite_MetadataTribblesTest_Test *this)

{
  istringstream *this_00;
  pointer pbVar1;
  allocator local_e1;
  string local_e0 [48];
  unique_ptr<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b0;
  unique_ptr<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  stream;
  Configuration default_conf;
  TestSuite_MetadataTribblesTest_Test *this_local;
  
  default_conf._144_8_ = this;
  Configuration::Configuration((Configuration *)&stream);
  default_conf.test_stream._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_1_ = 1;
  default_conf.delimiter.field_2._M_local_buf[0xc] = '\0';
  this_00 = (istringstream *)operator_new(0x180);
  std::__cxx11::istringstream::istringstream(this_00);
  std::unique_ptr<std::__cxx11::istringstream,std::default_delete<std::__cxx11::istringstream>>::
  unique_ptr<std::default_delete<std::__cxx11::istringstream>,void>
            ((unique_ptr<std::__cxx11::istringstream,std::default_delete<std::__cxx11::istringstream>>
              *)&local_b0,(pointer)this_00);
  pbVar1 = std::
           unique_ptr<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator->(&local_b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_e0,
             "CREATE TABLE ProjectHistory (\nbugs_fixed_2008  INT,\nbugs_fixed_2009  INT,\nbugs_fixed_2010  INT,\n2010  INT);\nCREATE TABLE Bugs_2008 ( . . . );\nALTER TABLE Customers ADD (revenue2002 NUMBER(9,2));\nCREATE TABLE Bugs_2009 (-- other columnsdate_reported DATE CHECK (EXTRACT(YEAR FROM date_reported) = 2009));\n"
             ,&local_e1);
  std::__cxx11::istringstream::str((string *)pbVar1);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  pbVar1 = std::
           unique_ptr<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::release(&local_b0);
  std::
  unique_ptr<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reset((unique_ptr<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&default_conf.risk_level,pbVar1);
  Check((Configuration *)&stream);
  std::
  unique_ptr<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&local_b0);
  Configuration::~Configuration((Configuration *)&stream);
  return;
}

Assistant:

TEST(TestSuite, MetadataTribblesTest) {

  Configuration default_conf;
  default_conf.testing_mode = true;
  default_conf.verbose = false;

  std::unique_ptr<std::istringstream> stream(new std::istringstream());
  stream->str(

      "CREATE TABLE ProjectHistory (\n" // 1
      "bugs_fixed_2008  INT,\n"         // 2
      "bugs_fixed_2009  INT,\n"         // 3
      "bugs_fixed_2010  INT,\n"         // 4
      "2010  INT"                       // 5
      ");\n"                            // 5

      "CREATE TABLE Bugs_2008 ( . . . );\n" // 6

      "ALTER TABLE Customers ADD (revenue2002 NUMBER(9,2));\n" // 7

      "CREATE TABLE Bugs_2009 (-- other columns" // 8
      "date_reported DATE CHECK (EXTRACT(YEAR FROM date_reported) = 2009));\n" // 8

  );

  default_conf.test_stream.reset(stream.release());

  Check(default_conf);

}